

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O1

uint64_t xorshift_rand(void)

{
  int iVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  
  uVar2 = *(ulong *)(in_FS_OFFSET + -0x28);
  if (uVar2 == 0) {
    iVar1 = rand();
    *(long *)(in_FS_OFFSET + -0x28) = (long)iVar1;
  }
  uVar2 = uVar2 >> 0xc ^ uVar2;
  uVar2 = uVar2 << 0x19 ^ uVar2;
  uVar2 = uVar2 >> 0x1b ^ uVar2;
  *(ulong *)(in_FS_OFFSET + -0x28) = uVar2;
  return uVar2 * 0x2545f4914f6cdd1d;
}

Assistant:

uint64_t
xorshift_rand(void)
{
    uint64_t x = seed;
    if (seed == 0) seed = rand();
    x ^= x >> 12;
    x ^= x << 25;
    x ^= x >> 27;
    seed = x;
    return x * 2685821657736338717LL;
}